

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

inform_dist * inform_dist_copy(inform_dist *src,inform_dist *dest)

{
  inform_dist *redest;
  inform_dist *dest_local;
  inform_dist *src_local;
  
  if (src == (inform_dist *)0x0) {
    src_local = (inform_dist *)0x0;
  }
  else {
    if ((dest == (inform_dist *)0x0) || (src->size != dest->size)) {
      redest = inform_dist_realloc(dest,src->size);
      if (redest == (inform_dist *)0x0) {
        return (inform_dist *)0x0;
      }
    }
    else {
      redest = dest;
      if (src == dest) {
        return dest;
      }
    }
    memcpy(redest->histogram,src->histogram,src->size << 2);
    redest->counts = src->counts;
    src_local = redest;
  }
  return src_local;
}

Assistant:

inform_dist* inform_dist_copy(inform_dist const *src, inform_dist *dest)
{
    // if the source is NULL, return NULL.
    if (src == NULL)
    {
        return NULL;
    }
    // if the destination is NULL or the destination size is not the same
    // as the source
    else if (dest == NULL || src->size != dest->size)
    {
        // reallocate the destination
        inform_dist *redest = inform_dist_realloc(dest, src->size);
        // return NULL if the allocation fails
        if (redest == NULL)
        {
            return NULL;
        }
        // point dest at the new distribution
        dest = redest;
    }
    // don't copy the source to itself
    else if (src == dest)
    {
        return dest;
    }
    // copy the contents of the histogram from the source to the destination
    memcpy(dest->histogram, src->histogram, src->size * sizeof(uint32_t));
    // set the counts appropriately
    dest->counts = src->counts;
    // return the modified destination
    return dest;
}